

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBorderClampTest::verifyImage
          (TextureBorderClampTest *this,Surface *renderedFrame,IterationConfig *config,
          ReferenceParams *samplerParams)

{
  Sampler *pSVar1;
  Vec4 *b;
  ostringstream *poVar2;
  float fVar3;
  Texture2D *pTVar4;
  TestLog *pTVar5;
  undefined8 uVar6;
  ReferenceParams *pRVar7;
  float s;
  float t;
  pointer pfVar8;
  deUint8 dVar9;
  bool bVar10;
  int ndx;
  float fVar11;
  RGBA RVar12;
  RenderTarget *pRVar13;
  IVec2 (*paIVar14) [4];
  TextureFormat TVar15;
  long lVar16;
  _anonymous_namespace_ *p_Var17;
  Vec4 *result;
  PixelFormat *pPVar18;
  Texture2DView *baseView;
  ConstPixelBufferAccess *pCVar19;
  Surface *pSVar20;
  LookupPrecision *pLVar21;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  void *__buf_11;
  void *__buf_12;
  void *__buf_13;
  void *__buf_14;
  int iVar22;
  _Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *this_00;
  int px_1;
  int iVar23;
  int px;
  undefined1 auVar24 [16];
  Texture2DView TVar25;
  allocator<char> local_483;
  allocator<char> local_482;
  allocator<char> local_481;
  float local_480;
  tcu local_47c [4];
  ReferenceParams *local_478;
  Vec2 viewportCoord;
  Vec2 texCoord_1;
  Vec2 viewportCoord_1;
  Vec4 resultPixel;
  Vec2 texCoord_2;
  Surface reference;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  Texture2DView effectiveView;
  undefined4 local_370;
  undefined4 local_36c;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
  srcLevelStorage_1;
  LookupPrecision local_338;
  Surface errorMask;
  undefined1 local_2e8 [8];
  Vector<float,_2> VStack_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  int local_2c8;
  ConstPixelBufferAccess local_2b8;
  PixelFormat pixelFormat;
  LodPrecision local_278;
  LodPrecision lodPrecision;
  Vec4 resultValue;
  vector<float,_std::allocator<float>_> texCoord;
  Vec4 referenceValue;
  
  pRVar13 = Context::getRenderTarget((this->super_TestCase).m_context);
  pPVar18 = &pRVar13->m_pixelFormat;
  iVar22 = pPVar18->redBits;
  iVar23 = (pRVar13->m_pixelFormat).greenBits;
  uVar6._0_4_ = (float)pPVar18->redBits;
  uVar6._4_4_ = (float)pPVar18->greenBits;
  local_480 = (float)(pRVar13->m_pixelFormat).blueBits;
  fVar11 = (float)(pRVar13->m_pixelFormat).alphaBits;
  lodPrecision.rule = RULE_OPENGL;
  lodPrecision.derivateBits = 0x16;
  lodPrecision.lodBits = 0x10;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  glu::TextureTestUtil::computeQuadTexCoord2D(&texCoord,&config->p0,&config->p1);
  lodPrecision.derivateBits = 0x12;
  lodPrecision.lodBits = 5;
  local_478 = samplerParams;
  if ((samplerParams->sampler).compare == COMPAREMODE_NONE) {
    TVar15 = tcu::getEffectiveDepthStencilTextureFormat
                       ((TextureFormat *)
                        &((this->m_texture).
                          super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.
                          m_data.ptr)->m_refTexture,this->m_sampleMode);
    resultValue.m_data[3] = fVar11;
    resultValue.m_data[2] = local_480;
    resultValue.m_data._0_8_ = uVar6;
    tcu::Vector<int,_4>::Vector
              ((Vector<int,_4> *)&local_338,
               2 - (uint)((TVar15.order & ~A) != sRGB &&
                         (((local_478->sampler).minFilter & ~NEAREST_MIPMAP_NEAREST) == NEAREST &&
                         (local_478->sampler).magFilter == NEAREST)));
    tcu::operator-((tcu *)&referenceValue,(Vector<int,_4> *)&resultValue,
                   (Vector<int,_4> *)&local_338);
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&local_2b8,0);
    tcu::max<int,4>((tcu *)&pixelFormat,(Vector<int,_4> *)&referenceValue,
                    (Vector<int,_4> *)&local_2b8);
    tcu::LookupPrecision::LookupPrecision(&local_338);
    tcu::computeFixedPointThreshold((tcu *)&resultValue,(IVec4 *)&pixelFormat);
    b = &(local_478->super_RenderParams).colorScale;
    tcu::operator/((tcu *)&referenceValue,&resultValue,b);
    pRVar7 = local_478;
    local_338.coordBits.m_data[0] = 0x14;
    local_338.coordBits.m_data[1] = 0x14;
    local_338.coordBits.m_data[2] = 0;
    local_338.uvwBits.m_data[0] = 5;
    local_338.uvwBits.m_data[1] = 5;
    local_338.uvwBits.m_data[2] = 0;
    local_338.colorMask.m_data[1] = 0 < iVar23;
    local_338.colorMask.m_data[0] = 0 < iVar22;
    local_338.colorMask.m_data[2] = 0 < (int)local_480;
    local_338.colorMask.m_data[3] = 0 < (int)fVar11;
    if (this->m_samplingFunction == SAMPLE_FILTER) {
      tcu::Surface::getAccess(&local_2b8,renderedFrame);
      pfVar8 = texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      pRVar7 = local_478;
      pRVar13 = Context::getRenderTarget((this->super_TestCase).m_context);
      srcLevelStorage.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._0_16_ = pRVar13->m_pixelFormat;
      tcu::Surface::Surface
                ((Surface *)&viewportCoord_1,local_2b8.m_size.m_data[0],local_2b8.m_size.m_data[1]);
      tcu::Surface::Surface
                ((Surface *)&srcLevelStorage_1,local_2b8.m_size.m_data[0],local_2b8.m_size.m_data[1]
                );
      tcu::SurfaceAccess::SurfaceAccess
                ((SurfaceAccess *)&referenceValue,(Surface *)&viewportCoord_1,
                 (PixelFormat *)&srcLevelStorage);
      pTVar4 = (this->m_texture).
               super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.m_data.ptr;
      resultValue.m_data._8_8_ = (pTVar4->m_refTexture).m_view.m_levels;
      resultValue.m_data[0] = (float)(pTVar4->m_refTexture).m_view.m_numLevels;
      glu::TextureTestUtil::sampleTexture
                ((SurfaceAccess *)&referenceValue,(Texture2DView *)&resultValue,pfVar8,pRVar7);
      tcu::Surface::getAccess((PixelBufferAccess *)&referenceValue,(Surface *)&viewportCoord_1);
      tcu::Surface::getAccess((PixelBufferAccess *)&resultValue,(Surface *)&srcLevelStorage_1);
      pTVar4 = (this->m_texture).
               super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.m_data.ptr;
      VStack_2e0.m_data = (float  [2])(pTVar4->m_refTexture).m_view.m_levels;
      baseView = (Texture2DView *)local_2e8;
      local_2e8._0_4_ = (pTVar4->m_refTexture).m_view.m_numLevels;
      local_370 = glu::TextureTestUtil::computeTextureLookupDiff
                            (&local_2b8,(ConstPixelBufferAccess *)&referenceValue,
                             (PixelBufferAccess *)&resultValue,baseView,pfVar8,pRVar7,&local_338,
                             &lodPrecision,
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->
                             m_watchDog);
      if (0 < (int)local_370) {
        pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar2 = (ostringstream *)(referenceValue.m_data + 2);
        referenceValue.m_data[0] = SUB84(pTVar5,0);
        referenceValue.m_data[1] = (float)((ulong)pTVar5 >> 0x20);
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::operator<<((ostream *)poVar2,"ERROR: Result verification failed, got ");
        std::ostream::operator<<(poVar2,local_370);
        std::operator<<((ostream *)poVar2," invalid pixels!");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&referenceValue,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar2);
      }
      pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_2e8,"VerifyResult",(allocator<char> *)&reference);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&resultPixel,"Verification result",(allocator<char> *)&errorMask);
      tcu::LogImageSet::LogImageSet
                ((LogImageSet *)&resultValue,(string *)local_2e8,(string *)&resultPixel);
      iVar22 = (int)pTVar5;
      tcu::LogImageSet::write((LogImageSet *)&resultValue,iVar22,__buf,(size_t)baseView);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&viewportCoord,"Rendered",(allocator<char> *)&effectiveView);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&texCoord_1,"Rendered image",(allocator<char> *)&texCoord_2);
      pCVar19 = &local_2b8;
      tcu::LogImage::LogImage
                ((LogImage *)&referenceValue,(string *)&viewportCoord,(string *)&texCoord_1,pCVar19,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)&referenceValue,iVar22,__buf_00,(size_t)pCVar19);
      tcu::LogImage::~LogImage((LogImage *)&referenceValue);
      std::__cxx11::string::~string((string *)&texCoord_1);
      std::__cxx11::string::~string((string *)&viewportCoord);
      tcu::LogImageSet::~LogImageSet((LogImageSet *)&resultValue);
      std::__cxx11::string::~string((string *)&resultPixel);
      std::__cxx11::string::~string((string *)local_2e8);
      if (0 < (int)local_370) {
        pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_2e8,"Reference",(allocator<char> *)&reference);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&resultPixel,"Ideal reference image",(allocator<char> *)&errorMask);
        pSVar20 = (Surface *)&viewportCoord_1;
        tcu::LogImage::LogImage
                  ((LogImage *)&referenceValue,(string *)local_2e8,(string *)&resultPixel,pSVar20,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        iVar22 = (int)pTVar5;
        tcu::LogImage::write((LogImage *)&referenceValue,iVar22,__buf_01,(size_t)pSVar20);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&viewportCoord,"ErrorMask",(allocator<char> *)&effectiveView);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&texCoord_1,"Error mask",(allocator<char> *)&texCoord_2);
        pSVar20 = (Surface *)&srcLevelStorage_1;
        tcu::LogImage::LogImage
                  ((LogImage *)&resultValue,(string *)&viewportCoord,(string *)&texCoord_1,pSVar20,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)&resultValue,iVar22,__buf_02,(size_t)pSVar20);
        tcu::LogImage::~LogImage((LogImage *)&resultValue);
        std::__cxx11::string::~string((string *)&texCoord_1);
        std::__cxx11::string::~string((string *)&viewportCoord);
        tcu::LogImage::~LogImage((LogImage *)&referenceValue);
        std::__cxx11::string::~string((string *)&resultPixel);
        std::__cxx11::string::~string((string *)local_2e8);
      }
      tcu::TestLog::endImageSet
                (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
      tcu::Surface::~Surface((Surface *)&srcLevelStorage_1);
      tcu::Surface::~Surface((Surface *)&viewportCoord_1);
    }
    else {
      if (this->m_samplingFunction != SAMPLE_GATHER) goto LAB_012a2fce;
      tcu::Surface::getAccess(&local_2b8,renderedFrame);
      local_2e8 = *(undefined1 (*) [8])
                   texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
      VStack_2e0.m_data =
           *(float (*) [2])
            (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start + 2);
      local_2d8._M_allocated_capacity =
           (size_type)
           *(float (*) [2])
            (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start + 4);
      local_2d8._8_8_ =
           *(float (*) [2])
            (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start + 6);
      pRVar13 = Context::getRenderTarget((this->super_TestCase).m_context);
      errorMask.m_width = (pRVar13->m_pixelFormat).redBits;
      errorMask.m_height = (pRVar13->m_pixelFormat).greenBits;
      errorMask.m_pixels.m_ptr = *(void **)&(pRVar13->m_pixelFormat).blueBits;
      dVar9 = tcu::getColorMask((PixelFormat *)&errorMask);
      srcLevelStorage_1.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      srcLevelStorage_1.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0);
      pTVar4 = (this->m_texture).
               super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.m_data.ptr;
      referenceValue.m_data[0] = (float)(pTVar4->m_refTexture).m_view.m_numLevels;
      result = (Vec4 *)(ulong)(uint)referenceValue.m_data[0];
      pCVar19 = (pTVar4->m_refTexture).m_view.m_levels;
      referenceValue.m_data[2] = SUB84(pCVar19,0);
      referenceValue.m_data[3] = (float)((ulong)pCVar19 >> 0x20);
      pSVar1 = &pRVar7->sampler;
      TVar25 = tcu::getEffectiveTextureView
                         ((Texture2DView *)&referenceValue,&srcLevelStorage_1,pSVar1);
      effectiveView.m_levels = TVar25.m_levels;
      effectiveView.m_numLevels = TVar25.m_numLevels;
      tcu::Surface::Surface
                ((Surface *)&srcLevelStorage,local_2b8.m_size.m_data[0],local_2b8.m_size.m_data[1]);
      tcu::Surface::Surface(&reference,local_2b8.m_size.m_data[0],local_2b8.m_size.m_data[1]);
      tcu::Surface::getAccess((PixelBufferAccess *)&referenceValue,&reference);
      resultPixel.m_data[0] = -1.7146522e+38;
      tcu::RGBA::toVec((RGBA *)&resultPixel);
      tcu::clear((PixelBufferAccess *)&referenceValue,&resultValue);
      local_478 = (ReferenceParams *)&(pRVar7->super_RenderParams).colorBias;
      local_370 = 0;
      for (iVar22 = 0;
          iVar22 < srcLevelStorage.
                   super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                   ._M_impl.super__Vector_impl_data._M_start._4_4_; iVar22 = iVar22 + 1) {
        for (iVar23 = 0;
            iVar23 < (int)srcLevelStorage.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start; iVar23 = iVar23 + 1) {
          resultValue.m_data[1] = (float)iVar22;
          resultValue.m_data[0] = (float)iVar23;
          resultPixel.m_data._0_8_ = &DAT_3f0000003f000000;
          tcu::operator+((Vector<float,_2> *)&resultValue,(Vector<float,_2> *)&resultPixel);
          viewportCoord.m_data[0] =
               (float)(int)srcLevelStorage.
                           super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                           ._M_impl.super__Vector_impl_data._M_start;
          viewportCoord.m_data[1] =
               (float)srcLevelStorage.
                      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                      ._M_impl.super__Vector_impl_data._M_start._4_4_;
          tcu::operator/((Vector<float,_2> *)&referenceValue,&viewportCoord);
          Functional::(anonymous_namespace)::triQuadInterpolate<tcu::Vector<float,2>>
                    ((_anonymous_namespace_ *)&texCoord_2,(Vector<float,_2> (*) [4])local_2e8,
                     viewportCoord_1.m_data[0],viewportCoord_1.m_data[1]);
          local_480 = texCoord_2.m_data[0];
          fVar11 = texCoord_2.m_data[1];
          glu::getDefaultGatherOffsets();
          tcu::Texture2DView::gatherOffsets
                    ((Texture2DView *)&referenceValue,(Sampler *)&effectiveView,local_480,fVar11,
                     (int)pSVar1,(IVec2 (*) [4])0x0);
          tcu::operator*((tcu *)&resultPixel,(Vector<float,_4> *)&referenceValue,b);
          tcu::operator+((tcu *)&resultValue,(Vector<float,_4> *)&resultPixel,
                         (Vector<float,_4> *)local_478);
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)&resultPixel,(int)&local_2b8,iVar23,iVar22);
          tcu::operator-((tcu *)&texCoord_1,(Vector<float,_4> *)&resultPixel,
                         (Vector<float,_4> *)local_478);
          tcu::operator/((tcu *)&viewportCoord,(Vector<float,_4> *)&texCoord_1,b);
          RVar12 = tcu::toRGBAMasked(&referenceValue,dVar9);
          result = (Vec4 *)(long)((int)srcLevelStorage.
                                       super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                       ._M_impl.super__Vector_impl_data._M_start * iVar22 + iVar23);
          ((srcLevelStorage.
            super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
            ._M_impl.super__Vector_impl_data._M_finish)->m_size).m_data
          [(long)((long)result[-1].m_data + 0xe)] = RVar12.m_value;
          tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&texCoord_1);
          for (lVar16 = 0; lVar16 != 4; lVar16 = lVar16 + 1) {
            fVar11 = resultPixel.m_data[lVar16];
            fVar3 = resultValue.m_data[lVar16];
            texCoord_1.m_data[lVar16] =
                 (float)(~-(uint)(fVar3 < fVar11) & (uint)(fVar3 - fVar11) |
                        (uint)(fVar11 - fVar3) & -(uint)(fVar3 < fVar11));
          }
          tcu::greaterThan<float,4>
                    (local_47c,(Vector<float,_4> *)&texCoord_1,&local_338.colorThreshold);
          tcu::logicalAnd<bool,4>
                    ((tcu *)&local_278,&local_338.colorMask,(Vector<bool,_4> *)local_47c);
          bVar10 = tcu::boolAny<4>((Vector<bool,_4> *)&local_278);
          if (bVar10) {
            paIVar14 = glu::getDefaultGatherOffsets();
            result = (Vec4 *)&viewportCoord;
            bVar10 = tcu::isGatherOffsetsResultValid
                               (&effectiveView,pSVar1,&local_338,&texCoord_2,0,paIVar14,result);
            if (!bVar10) {
              *(undefined4 *)
               ((long)reference.m_pixels.m_ptr + (long)(reference.m_width * iVar22 + iVar23) * 4) =
                   0xff0000ff;
              local_370 = local_370 + 1;
              result = (Vec4 *)reference.m_pixels.m_ptr;
            }
          }
        }
      }
      if (0 < (int)local_370) {
        pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar2 = (ostringstream *)(referenceValue.m_data + 2);
        referenceValue.m_data[0] = SUB84(pTVar5,0);
        referenceValue.m_data[1] = (float)((ulong)pTVar5 >> 0x20);
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::operator<<((ostream *)poVar2,"ERROR: Result verification failed, got ");
        std::ostream::operator<<(poVar2,local_370);
        std::operator<<((ostream *)poVar2," invalid pixels!");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&referenceValue,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar2);
      }
      pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&resultPixel,"VerifyResult",(allocator<char> *)&texCoord_2);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&viewportCoord,"Verification result",(allocator<char> *)&local_278);
      tcu::LogImageSet::LogImageSet
                ((LogImageSet *)&resultValue,(string *)&resultPixel,(string *)&viewportCoord);
      iVar22 = (int)pTVar5;
      tcu::LogImageSet::write((LogImageSet *)&resultValue,iVar22,__buf_03,(size_t)result);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&texCoord_1,"Rendered",(allocator<char> *)local_47c);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&viewportCoord_1,"Rendered image",&local_483);
      pCVar19 = &local_2b8;
      tcu::LogImage::LogImage
                ((LogImage *)&referenceValue,(string *)&texCoord_1,(string *)&viewportCoord_1,
                 pCVar19,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)&referenceValue,iVar22,__buf_04,(size_t)pCVar19);
      tcu::LogImage::~LogImage((LogImage *)&referenceValue);
      std::__cxx11::string::~string((string *)&viewportCoord_1);
      std::__cxx11::string::~string((string *)&texCoord_1);
      tcu::LogImageSet::~LogImageSet((LogImageSet *)&resultValue);
      std::__cxx11::string::~string((string *)&viewportCoord);
      std::__cxx11::string::~string((string *)&resultPixel);
      if (0 < (int)local_370) {
        pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&resultPixel,"Reference",(allocator<char> *)&texCoord_2);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&viewportCoord,"Ideal reference image",(allocator<char> *)&local_278);
        pSVar20 = (Surface *)&srcLevelStorage;
        tcu::LogImage::LogImage
                  ((LogImage *)&referenceValue,(string *)&resultPixel,(string *)&viewportCoord,
                   pSVar20,QP_IMAGE_COMPRESSION_MODE_BEST);
        iVar22 = (int)pTVar5;
        tcu::LogImage::write((LogImage *)&referenceValue,iVar22,__buf_05,(size_t)pSVar20);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&texCoord_1,"ErrorMask",(allocator<char> *)local_47c);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&viewportCoord_1,"Error mask",&local_483);
        pSVar20 = &reference;
        tcu::LogImage::LogImage
                  ((LogImage *)&resultValue,(string *)&texCoord_1,(string *)&viewportCoord_1,pSVar20
                   ,QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)&resultValue,iVar22,__buf_06,(size_t)pSVar20);
        tcu::LogImage::~LogImage((LogImage *)&resultValue);
        std::__cxx11::string::~string((string *)&viewportCoord_1);
        std::__cxx11::string::~string((string *)&texCoord_1);
        tcu::LogImage::~LogImage((LogImage *)&referenceValue);
        std::__cxx11::string::~string((string *)&viewportCoord);
        std::__cxx11::string::~string((string *)&resultPixel);
      }
      tcu::TestLog::endImageSet
                (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
      tcu::Surface::~Surface(&reference);
      tcu::Surface::~Surface((Surface *)&srcLevelStorage);
      std::_Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
      ~_Vector_base(&srcLevelStorage_1.
                     super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                   );
    }
joined_r0x012a2a30:
    if (local_370 == 0) goto LAB_012a300e;
  }
  else {
    tcu::TexComparePrecision::TexComparePrecision((TexComparePrecision *)&local_2b8);
    tcu::TexComparePrecision::TexComparePrecision((TexComparePrecision *)local_2e8);
    local_278.derivateBits = lodPrecision.derivateBits;
    local_278.rule = lodPrecision.rule;
    local_2b8.m_format.order = DS;
    local_2b8.m_format.type = SIGNED_INT_1010102_REV;
    local_2b8.m_size.m_data[0] = 0;
    local_2b8.m_size.m_data[1] = 7;
    local_2b8.m_size.m_data[2] = 7;
    local_2b8.m_pitch.m_data[0] = 0;
    local_2b8.m_pitch.m_data[1] = 5;
    local_2b8.m_pitch.m_data[2] = 0x10;
    iVar22 = iVar22 + -1;
    local_2c8 = 0;
    if (0 < iVar22) {
      local_2c8 = iVar22;
    }
    local_2e8._0_4_ = 2.8026e-44;
    local_2e8._4_4_ = 2.8026e-44;
    VStack_2e0.m_data[0] = 0.0;
    VStack_2e0.m_data[1] = 5.60519e-45;
    local_2d8._M_allocated_capacity._0_4_ = 5.60519e-45;
    local_2d8._M_allocated_capacity._4_4_ = 0.0;
    local_2d8._8_4_ = 0.0;
    local_2d8._12_4_ = 2.24208e-44;
    local_278.lodBits = 4;
    local_2b8.m_data._0_4_ = local_2c8;
    if (this->m_samplingFunction == SAMPLE_FILTER) {
      tcu::Surface::getAccess((ConstPixelBufferAccess *)&local_338,renderedFrame);
      pfVar8 = texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      pRVar13 = Context::getRenderTarget((this->super_TestCase).m_context);
      errorMask.m_width = (pRVar13->m_pixelFormat).redBits;
      errorMask.m_height = (pRVar13->m_pixelFormat).greenBits;
      errorMask.m_pixels.m_ptr = *(void **)&(pRVar13->m_pixelFormat).blueBits;
      resultValue.m_data._0_8_ = errorMask._0_8_;
      resultValue.m_data._8_8_ = errorMask.m_pixels.m_ptr;
      tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&resultPixel,1);
      tcu::operator-((tcu *)&referenceValue,(Vector<int,_4> *)&resultValue,
                     (Vector<int,_4> *)&resultPixel);
      tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&viewportCoord,0);
      tcu::max<int,4>((tcu *)&effectiveView,(Vector<int,_4> *)&referenceValue,
                      (Vector<int,_4> *)&viewportCoord);
      tcu::computeFixedPointThreshold((tcu *)&referenceValue,(IVec4 *)&effectiveView);
      pRVar7 = local_478;
      texCoord_2.m_data[1] = referenceValue.m_data[2];
      texCoord_2.m_data[0] = referenceValue.m_data[1];
      srcLevelStorage_1.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      srcLevelStorage_1.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      srcLevelStorage_1.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pTVar4 = (this->m_texture).
               super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.m_data.ptr;
      referenceValue.m_data[0] = (float)(pTVar4->m_refTexture).m_view.m_numLevels;
      pCVar19 = (pTVar4->m_refTexture).m_view.m_levels;
      referenceValue.m_data[2] = SUB84(pCVar19,0);
      referenceValue.m_data[3] = (float)((ulong)pCVar19 >> 0x20);
      TVar25 = tcu::getEffectiveTextureView
                         ((Texture2DView *)&referenceValue,&srcLevelStorage_1,&local_478->sampler);
      pixelFormat._8_8_ = TVar25.m_levels;
      pixelFormat.redBits = TVar25.m_numLevels;
      tcu::Surface::Surface
                ((Surface *)&srcLevelStorage,local_338.coordBits.m_data[2],
                 local_338.uvwBits.m_data[0]);
      tcu::Surface::Surface(&reference,local_338.coordBits.m_data[2],local_338.uvwBits.m_data[0]);
      tcu::SurfaceAccess::SurfaceAccess
                ((SurfaceAccess *)&referenceValue,(Surface *)&srcLevelStorage,
                 (PixelFormat *)&errorMask);
      glu::TextureTestUtil::sampleTexture
                ((SurfaceAccess *)&referenceValue,(Texture2DView *)&pixelFormat,pfVar8,pRVar7);
      tcu::Surface::getAccess((PixelBufferAccess *)&referenceValue,(Surface *)&srcLevelStorage);
      tcu::Surface::getAccess((PixelBufferAccess *)&resultValue,&reference);
      pPVar18 = &pixelFormat;
      local_370 = glu::TextureTestUtil::computeTextureCompareDiff
                            ((ConstPixelBufferAccess *)&local_338,
                             (ConstPixelBufferAccess *)&referenceValue,
                             (PixelBufferAccess *)&resultValue,(Texture2DView *)pPVar18,pfVar8,
                             local_478,(TexComparePrecision *)&local_2b8,&lodPrecision,
                             (Vec3 *)&texCoord_2);
      if ((int)local_370 < 1) {
LAB_012a2d74:
        bVar10 = false;
      }
      else {
        pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar2 = (ostringstream *)(referenceValue.m_data + 2);
        referenceValue.m_data[0] = SUB84(pTVar5,0);
        referenceValue.m_data[1] = (float)((ulong)pTVar5 >> 0x20);
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::operator<<((ostream *)poVar2,
                        "Warning: Verification assuming high-quality PCF filtering failed.");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&referenceValue,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar2);
        tcu::Surface::getAccess((PixelBufferAccess *)&referenceValue,(Surface *)&srcLevelStorage);
        tcu::Surface::getAccess((PixelBufferAccess *)&resultValue,&reference);
        pPVar18 = &pixelFormat;
        local_370 = glu::TextureTestUtil::computeTextureCompareDiff
                              ((ConstPixelBufferAccess *)&local_338,
                               (ConstPixelBufferAccess *)&referenceValue,
                               (PixelBufferAccess *)&resultValue,(Texture2DView *)pPVar18,pfVar8,
                               local_478,(TexComparePrecision *)local_2e8,&local_278,
                               (Vec3 *)&texCoord_2);
        if ((int)local_370 < 1) {
          if (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_testResult ==
              QP_TEST_RESULT_PASS) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&referenceValue,"Low-quality result",
                       (allocator<char> *)&resultValue);
            tcu::ResultCollector::addResult
                      (&this->m_result,QP_TEST_RESULT_QUALITY_WARNING,(string *)&referenceValue);
            std::__cxx11::string::~string((string *)&referenceValue);
          }
          goto LAB_012a2d74;
        }
        pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar2 = (ostringstream *)(referenceValue.m_data + 2);
        referenceValue.m_data[0] = SUB84(pTVar5,0);
        referenceValue.m_data[1] = (float)((ulong)pTVar5 >> 0x20);
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::operator<<((ostream *)poVar2,
                        "ERROR: Verification against low precision requirements failed, failing test case."
                       );
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&referenceValue,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar2);
        pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar2 = (ostringstream *)(referenceValue.m_data + 2);
        referenceValue.m_data[0] = SUB84(pTVar5,0);
        referenceValue.m_data[1] = (float)((ulong)pTVar5 >> 0x20);
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::operator<<((ostream *)poVar2,"ERROR: Result verification failed, got ");
        std::ostream::operator<<(poVar2,local_370);
        std::operator<<((ostream *)poVar2," invalid pixels!");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&referenceValue,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar2);
        bVar10 = true;
        local_370 = 1;
      }
      pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&resultPixel,"VerifyResult",(allocator<char> *)local_47c);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&viewportCoord,"Verification result",&local_483);
      tcu::LogImageSet::LogImageSet
                ((LogImageSet *)&resultValue,(string *)&resultPixel,(string *)&viewportCoord);
      iVar22 = (int)pTVar5;
      tcu::LogImageSet::write((LogImageSet *)&resultValue,iVar22,__buf_11,(size_t)pPVar18);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&texCoord_1,"Rendered",&local_481);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&viewportCoord_1,"Rendered image",&local_482);
      pLVar21 = &local_338;
      tcu::LogImage::LogImage
                ((LogImage *)&referenceValue,(string *)&texCoord_1,(string *)&viewportCoord_1,
                 (ConstPixelBufferAccess *)pLVar21,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)&referenceValue,iVar22,__buf_12,(size_t)pLVar21);
      tcu::LogImage::~LogImage((LogImage *)&referenceValue);
      std::__cxx11::string::~string((string *)&viewportCoord_1);
      std::__cxx11::string::~string((string *)&texCoord_1);
      tcu::LogImageSet::~LogImageSet((LogImageSet *)&resultValue);
      std::__cxx11::string::~string((string *)&viewportCoord);
      std::__cxx11::string::~string((string *)&resultPixel);
      if (bVar10) {
        pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&resultPixel,"Reference",(allocator<char> *)local_47c);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&viewportCoord,"Ideal reference image",&local_483);
        pSVar20 = (Surface *)&srcLevelStorage;
        tcu::LogImage::LogImage
                  ((LogImage *)&referenceValue,(string *)&resultPixel,(string *)&viewportCoord,
                   pSVar20,QP_IMAGE_COMPRESSION_MODE_BEST);
        iVar22 = (int)pTVar5;
        tcu::LogImage::write((LogImage *)&referenceValue,iVar22,__buf_13,(size_t)pSVar20);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&texCoord_1,"ErrorMask",&local_481);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&viewportCoord_1,"Error mask",&local_482);
        pSVar20 = &reference;
        tcu::LogImage::LogImage
                  ((LogImage *)&resultValue,(string *)&texCoord_1,(string *)&viewportCoord_1,pSVar20
                   ,QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)&resultValue,iVar22,__buf_14,(size_t)pSVar20);
        tcu::LogImage::~LogImage((LogImage *)&resultValue);
        std::__cxx11::string::~string((string *)&viewportCoord_1);
        std::__cxx11::string::~string((string *)&texCoord_1);
        tcu::LogImage::~LogImage((LogImage *)&referenceValue);
        std::__cxx11::string::~string((string *)&viewportCoord);
        std::__cxx11::string::~string((string *)&resultPixel);
      }
      tcu::TestLog::endImageSet
                (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
      tcu::Surface::~Surface(&reference);
      tcu::Surface::~Surface((Surface *)&srcLevelStorage);
      this_00 = &srcLevelStorage_1.
                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
      ;
LAB_012a2fc5:
      std::_Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
      ~_Vector_base(this_00);
      goto joined_r0x012a2a30;
    }
    if (this->m_samplingFunction == SAMPLE_GATHER) {
      tcu::Surface::getAccess((ConstPixelBufferAccess *)&local_338,renderedFrame);
      resultPixel.m_data._0_8_ =
           *(undefined8 *)
            texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
      resultPixel.m_data._8_8_ =
           *(undefined8 *)
            (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start + 2);
      srcLevelStorage.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      srcLevelStorage.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      srcLevelStorage.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pTVar4 = (this->m_texture).
               super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.m_data.ptr;
      referenceValue.m_data[0] = (float)(pTVar4->m_refTexture).m_view.m_numLevels;
      p_Var17 = (_anonymous_namespace_ *)(ulong)(uint)referenceValue.m_data[0];
      pCVar19 = (pTVar4->m_refTexture).m_view.m_levels;
      referenceValue.m_data[2] = SUB84(pCVar19,0);
      referenceValue.m_data[3] = (float)((ulong)pCVar19 >> 0x20);
      pSVar1 = &local_478->sampler;
      TVar25 = tcu::getEffectiveTextureView
                         ((Texture2DView *)&referenceValue,&srcLevelStorage,pSVar1);
      effectiveView.m_levels = TVar25.m_levels;
      effectiveView.m_numLevels = TVar25.m_numLevels;
      pRVar13 = Context::getRenderTarget((this->super_TestCase).m_context);
      pixelFormat.redBits = (pRVar13->m_pixelFormat).redBits;
      pixelFormat.greenBits = (pRVar13->m_pixelFormat).greenBits;
      pixelFormat.blueBits = (pRVar13->m_pixelFormat).blueBits;
      pixelFormat.alphaBits = (pRVar13->m_pixelFormat).alphaBits;
      auVar24._0_4_ = -(uint)(0 < pixelFormat.redBits);
      auVar24._4_4_ = -(uint)(0 < pixelFormat.greenBits);
      auVar24._8_4_ = -(uint)(0 < pixelFormat.blueBits);
      auVar24._12_4_ = -(uint)(0 < pixelFormat.alphaBits);
      auVar24 = packssdw(auVar24,auVar24);
      auVar24 = packsswb(auVar24,auVar24);
      texCoord_2.m_data[0] = (float)(auVar24._0_4_ & (uint)DAT_017d1ce0);
      dVar9 = tcu::getColorMask(&pixelFormat);
      tcu::Surface::Surface(&reference,local_338.coordBits.m_data[2],local_338.uvwBits.m_data[0]);
      tcu::Surface::Surface(&errorMask,local_338.coordBits.m_data[2],local_338.uvwBits.m_data[0]);
      tcu::Surface::getAccess((PixelBufferAccess *)&referenceValue,&errorMask);
      viewportCoord.m_data[0] = -1.7146522e+38;
      tcu::RGBA::toVec((RGBA *)&viewportCoord);
      tcu::clear((PixelBufferAccess *)&referenceValue,&resultValue);
      local_370 = 0;
      local_36c = 0;
      fVar11 = 0.0;
      while ((int)fVar11 < reference.m_height) {
        local_480 = fVar11;
        for (iVar22 = 0; iVar22 < reference.m_width; iVar22 = iVar22 + 1) {
          resultValue.m_data[1] = (float)(int)fVar11;
          resultValue.m_data[0] = (float)iVar22;
          texCoord_1.m_data = (float  [2])&DAT_3f0000003f000000;
          tcu::operator+((Vector<float,_2> *)&resultValue,(Vector<float,_2> *)&texCoord_1);
          viewportCoord_1.m_data[0] = (float)reference.m_width;
          viewportCoord_1.m_data[1] = (float)reference.m_height;
          tcu::operator/((Vector<float,_2> *)&referenceValue,&viewportCoord_1);
          Functional::(anonymous_namespace)::triQuadInterpolate<tcu::Vector<float,2>>
                    ((_anonymous_namespace_ *)&texCoord_1,(Vector<float,_2> (*) [4])&resultPixel,
                     viewportCoord.m_data[0],viewportCoord.m_data[1]);
          fVar3 = (local_478->super_RenderParams).ref;
          s = texCoord_1.m_data[0];
          t = texCoord_1.m_data[1];
          glu::getDefaultGatherOffsets();
          tcu::Texture2DView::gatherOffsetsCompare
                    ((Texture2DView *)&referenceValue,(Sampler *)&effectiveView,fVar3,s,t,
                     (IVec2 (*) [4])pSVar1);
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)&resultValue,(int)&local_338,iVar22,(int)local_480);
          RVar12 = tcu::toRGBAMasked(&referenceValue,dVar9);
          p_Var17 = (_anonymous_namespace_ *)(long)(reference.m_width * (int)local_480 + iVar22);
          *(deUint32 *)((long)reference.m_pixels.m_ptr + (long)p_Var17 * 4) = RVar12.m_value;
          tcu::notEqual<float,4>
                    ((tcu *)&srcLevelStorage_1,(Vector<float,_4> *)&referenceValue,
                     (Vector<float,_4> *)&resultValue);
          tcu::logicalAnd<bool,4>
                    ((tcu *)&viewportCoord_1,(Vector<bool,_4> *)&texCoord_2,
                     (Vector<bool,_4> *)&srcLevelStorage_1);
          bVar10 = tcu::boolAny<4>((Vector<bool,_4> *)&viewportCoord_1);
          if (bVar10) {
            paIVar14 = glu::getDefaultGatherOffsets();
            p_Var17 = (_anonymous_namespace_ *)&texCoord_1;
            bVar10 = tcu::isGatherOffsetsCompareResultValid
                               (&effectiveView,pSVar1,(TexComparePrecision *)&local_2b8,&texCoord_1,
                                paIVar14,fVar3,&resultValue);
            if (!bVar10) {
              paIVar14 = glu::getDefaultGatherOffsets();
              p_Var17 = (_anonymous_namespace_ *)&texCoord_1;
              bVar10 = tcu::isGatherOffsetsCompareResultValid
                                 (&effectiveView,pSVar1,(TexComparePrecision *)local_2e8,&texCoord_1
                                  ,paIVar14,fVar3,&resultValue);
              p_Var17 = (_anonymous_namespace_ *)CONCAT71((int7)((ulong)p_Var17 >> 8),1);
              local_36c = SUB84(p_Var17,0);
              if (!bVar10) {
                *(undefined4 *)
                 ((long)errorMask.m_pixels.m_ptr +
                 (long)(errorMask.m_width * (int)local_480 + iVar22) * 4) = 0xff0000ff;
                local_370 = local_370 + 1;
                p_Var17 = (_anonymous_namespace_ *)errorMask.m_pixels.m_ptr;
              }
            }
          }
        }
        fVar11 = (float)((int)local_480 + 1);
      }
      if ((int)local_370 < 1) {
        if ((local_36c & 1) != 0) {
          pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          poVar2 = (ostringstream *)(referenceValue.m_data + 2);
          referenceValue.m_data[0] = SUB84(pTVar5,0);
          referenceValue.m_data[1] = (float)((ulong)pTVar5 >> 0x20);
          std::__cxx11::ostringstream::ostringstream(poVar2);
          std::operator<<((ostream *)poVar2,
                          "Warning: Verification assuming high-quality PCF filtering failed.");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&referenceValue,(EndMessageToken *)&tcu::TestLog::EndMessage)
          ;
          std::__cxx11::ostringstream::~ostringstream(poVar2);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&referenceValue,"Low-quality result",(allocator<char> *)&resultValue)
          ;
          tcu::ResultCollector::addResult
                    (&this->m_result,QP_TEST_RESULT_QUALITY_WARNING,(string *)&referenceValue);
          std::__cxx11::string::~string((string *)&referenceValue);
        }
      }
      else {
        pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar2 = (ostringstream *)(referenceValue.m_data + 2);
        referenceValue.m_data[0] = SUB84(pTVar5,0);
        referenceValue.m_data[1] = (float)((ulong)pTVar5 >> 0x20);
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::operator<<((ostream *)poVar2,"ERROR: Result verification failed, got ");
        std::ostream::operator<<(poVar2,local_370);
        std::operator<<((ostream *)poVar2," invalid pixels!");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&referenceValue,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar2);
      }
      pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&viewportCoord,"VerifyResult",(allocator<char> *)local_47c);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&texCoord_1,"Verification result",&local_483);
      tcu::LogImageSet::LogImageSet
                ((LogImageSet *)&resultValue,(string *)&viewportCoord,(string *)&texCoord_1);
      iVar22 = (int)pTVar5;
      tcu::LogImageSet::write((LogImageSet *)&resultValue,iVar22,__buf_07,(size_t)p_Var17);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&viewportCoord_1,"Rendered",&local_481);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&srcLevelStorage_1,"Rendered image",&local_482);
      pLVar21 = &local_338;
      tcu::LogImage::LogImage
                ((LogImage *)&referenceValue,(string *)&viewportCoord_1,(string *)&srcLevelStorage_1
                 ,(ConstPixelBufferAccess *)pLVar21,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)&referenceValue,iVar22,__buf_08,(size_t)pLVar21);
      tcu::LogImage::~LogImage((LogImage *)&referenceValue);
      std::__cxx11::string::~string((string *)&srcLevelStorage_1);
      std::__cxx11::string::~string((string *)&viewportCoord_1);
      tcu::LogImageSet::~LogImageSet((LogImageSet *)&resultValue);
      std::__cxx11::string::~string((string *)&texCoord_1);
      std::__cxx11::string::~string((string *)&viewportCoord);
      if (0 < (int)local_370) {
        pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&viewportCoord,"Reference",(allocator<char> *)local_47c);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&texCoord_1,"Ideal reference image",&local_483);
        pSVar20 = &reference;
        tcu::LogImage::LogImage
                  ((LogImage *)&referenceValue,(string *)&viewportCoord,(string *)&texCoord_1,
                   pSVar20,QP_IMAGE_COMPRESSION_MODE_BEST);
        iVar22 = (int)pTVar5;
        tcu::LogImage::write((LogImage *)&referenceValue,iVar22,__buf_09,(size_t)pSVar20);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&viewportCoord_1,"ErrorMask",&local_481);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&srcLevelStorage_1,"Error mask",&local_482);
        pSVar20 = &errorMask;
        tcu::LogImage::LogImage
                  ((LogImage *)&resultValue,(string *)&viewportCoord_1,(string *)&srcLevelStorage_1,
                   pSVar20,QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)&resultValue,iVar22,__buf_10,(size_t)pSVar20);
        tcu::LogImage::~LogImage((LogImage *)&resultValue);
        std::__cxx11::string::~string((string *)&srcLevelStorage_1);
        std::__cxx11::string::~string((string *)&viewportCoord_1);
        tcu::LogImage::~LogImage((LogImage *)&referenceValue);
        std::__cxx11::string::~string((string *)&texCoord_1);
        std::__cxx11::string::~string((string *)&viewportCoord);
      }
      tcu::TestLog::endImageSet
                (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
      tcu::Surface::~Surface(&errorMask);
      tcu::Surface::~Surface(&reference);
      this_00 = &srcLevelStorage.
                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
      ;
      goto LAB_012a2fc5;
    }
  }
LAB_012a2fce:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&referenceValue,"Image verification failed",(allocator<char> *)&resultValue);
  tcu::ResultCollector::fail(&this->m_result,(string *)&referenceValue);
  std::__cxx11::string::~string((string *)&referenceValue);
LAB_012a300e:
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&texCoord.super__Vector_base<float,_std::allocator<float>_>);
  return;
}

Assistant:

void TextureBorderClampTest::verifyImage (const tcu::Surface&							renderedFrame,
										  const IterationConfig&						config,
										  const glu::TextureTestUtil::ReferenceParams&	samplerParams)
{
	const tcu::PixelFormat	pixelFormat		= m_context.getRenderTarget().getPixelFormat();

	tcu::LodPrecision		lodPrecision	(tcu::LodPrecision::RULE_OPENGL);
	std::vector<float>		texCoord;
	bool					verificationOk;

	glu::TextureTestUtil::computeQuadTexCoord2D(texCoord, config.p0, config.p1);

	lodPrecision.derivateBits		= 18;
	lodPrecision.lodBits			= 5;

	if (samplerParams.sampler.compare == tcu::Sampler::COMPAREMODE_NONE)
	{
		const tcu::TextureFormat		texFormat			= tcu::getEffectiveDepthStencilTextureFormat(m_texture->getRefTexture().getFormat(), m_sampleMode);
		const bool						isNearestMinFilter	= samplerParams.sampler.minFilter == tcu::Sampler::NEAREST || samplerParams.sampler.minFilter == tcu::Sampler::NEAREST_MIPMAP_NEAREST;
		const bool						isNearestMagFilter	= samplerParams.sampler.magFilter == tcu::Sampler::NEAREST;
		const bool						isNearestOnly		= isNearestMinFilter && isNearestMagFilter;
		const bool						isSRGB				= texFormat.order == tcu::TextureFormat::sRGB || texFormat.order == tcu::TextureFormat::sRGBA;
		const int						colorErrorBits		= (isNearestOnly && !isSRGB) ? (1) : (2);
		const tcu::IVec4				colorBits			= tcu::max(glu::TextureTestUtil::getBitsVec(pixelFormat) - tcu::IVec4(colorErrorBits), tcu::IVec4(0));
		tcu::LookupPrecision			lookupPrecision;

		lookupPrecision.colorThreshold	= tcu::computeFixedPointThreshold(colorBits) / samplerParams.colorScale;
		lookupPrecision.coordBits		= tcu::IVec3(20,20,0);
		lookupPrecision.uvwBits			= tcu::IVec3(5,5,0);
		lookupPrecision.colorMask		= glu::TextureTestUtil::getCompareMask(pixelFormat);

		if (m_samplingFunction == SAMPLE_FILTER)
		{
			verificationOk = verifyTextureSampleResult(renderedFrame.getAccess(),
													   &texCoord[0],
													   samplerParams,
													   lodPrecision,
													   lookupPrecision);
		}
		else if (m_samplingFunction == SAMPLE_GATHER)
		{
			verificationOk = verifyTextureGatherResult(renderedFrame.getAccess(),
													   &texCoord[0],
													   samplerParams,
													   lookupPrecision);
		}
		else
		{
			DE_ASSERT(false);
			verificationOk = false;
		}
	}
	else
	{
		tcu::TexComparePrecision	texComparePrecision;
		tcu::TexComparePrecision	lowQualityTexComparePrecision;
		tcu::LodPrecision			lowQualityLodPrecision			= lodPrecision;

		texComparePrecision.coordBits					= tcu::IVec3(20,20,0);
		texComparePrecision.uvwBits						= tcu::IVec3(7,7,0);
		texComparePrecision.pcfBits						= 5;
		texComparePrecision.referenceBits				= 16;
		texComparePrecision.resultBits					= de::max(0, pixelFormat.redBits - 1);

		lowQualityTexComparePrecision.coordBits			= tcu::IVec3(20,20,0);
		lowQualityTexComparePrecision.uvwBits			= tcu::IVec3(4,4,0);
		lowQualityTexComparePrecision.pcfBits			= 0;
		lowQualityTexComparePrecision.referenceBits		= 16;
		lowQualityTexComparePrecision.resultBits		= de::max(0, pixelFormat.redBits - 1);

		lowQualityLodPrecision.lodBits					= 4;

		if (m_samplingFunction == SAMPLE_FILTER)
		{
			verificationOk = verifyTextureCompareResult(renderedFrame.getAccess(),
														&texCoord[0],
														samplerParams,
														texComparePrecision,
														lowQualityTexComparePrecision,
														lodPrecision,
														lowQualityLodPrecision);
		}
		else if (m_samplingFunction == SAMPLE_GATHER)
		{
			verificationOk = verifyTextureGatherCmpResult(renderedFrame.getAccess(),
														  &texCoord[0],
														  samplerParams,
														  texComparePrecision,
														  lowQualityTexComparePrecision);
		}
		else
		{
			DE_ASSERT(false);
			verificationOk = false;
		}
	}

	if (!verificationOk)
		m_result.fail("Image verification failed");
}